

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

GenvarDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::GenvarDeclarationSyntax,slang::syntax::GenvarDeclarationSyntax_const&>
          (BumpAllocator *this,GenvarDeclarationSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  GenvarDeclarationSyntax *pGVar8;
  
  pGVar8 = (GenvarDeclarationSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((GenvarDeclarationSyntax *)this->endPtr < pGVar8 + 1) {
    pGVar8 = (GenvarDeclarationSyntax *)allocateSlow(this,0xa8,8);
  }
  else {
    this->head->current = (byte *)(pGVar8 + 1);
  }
  (pGVar8->super_MemberSyntax).super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).super_SyntaxNode.previewNode;
  uVar4 = *(undefined4 *)&(args->super_MemberSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).super_SyntaxNode.parent;
  (pGVar8->super_MemberSyntax).super_SyntaxNode.kind =
       (args->super_MemberSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pGVar8->super_MemberSyntax).super_SyntaxNode.field_0x4 = uVar4;
  (pGVar8->super_MemberSyntax).super_SyntaxNode.parent = pSVar1;
  uVar4 = *(undefined4 *)
           &(args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pGVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pGVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pGVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pGVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pGVar8->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005ade68;
  (pGVar8->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pGVar8->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pGVar8->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pGVar8->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005b0da0;
  uVar5 = (args->keyword).field_0x2;
  NVar6.raw = (args->keyword).numFlags.raw;
  uVar7 = (args->keyword).rawLen;
  pIVar3 = (args->keyword).info;
  (pGVar8->keyword).kind = (args->keyword).kind;
  (pGVar8->keyword).field_0x2 = uVar5;
  (pGVar8->keyword).numFlags = (NumericTokenFlags)NVar6.raw;
  (pGVar8->keyword).rawLen = uVar7;
  (pGVar8->keyword).info = pIVar3;
  uVar4 = *(undefined4 *)&(args->identifiers).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->identifiers).super_SyntaxListBase.super_SyntaxNode.parent;
  (pGVar8->identifiers).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->identifiers).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pGVar8->identifiers).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pGVar8->identifiers).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pGVar8->identifiers).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->identifiers).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pGVar8->identifiers).super_SyntaxListBase.childCount =
       (args->identifiers).super_SyntaxListBase.childCount;
  (pGVar8->identifiers).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005b1608;
  sVar2 = (args->identifiers).elements._M_extent._M_extent_value;
  (pGVar8->identifiers).elements._M_ptr = (args->identifiers).elements._M_ptr;
  (pGVar8->identifiers).elements._M_extent._M_extent_value = sVar2;
  uVar5 = (args->semi).field_0x2;
  NVar6.raw = (args->semi).numFlags.raw;
  uVar7 = (args->semi).rawLen;
  pIVar3 = (args->semi).info;
  (pGVar8->semi).kind = (args->semi).kind;
  (pGVar8->semi).field_0x2 = uVar5;
  (pGVar8->semi).numFlags = (NumericTokenFlags)NVar6.raw;
  (pGVar8->semi).rawLen = uVar7;
  (pGVar8->semi).info = pIVar3;
  return pGVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }